

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O2

void __thiscall
EnvironmentNAVXYTHETALAT::GetPredsofChangedEdges
          (EnvironmentNAVXYTHETALAT *this,
          vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *changedcellsV,
          vector<int,_std::allocator<int>_> *preds_of_changededgesIDV)

{
  int *piVar1;
  value_type vVar2;
  const_reference pvVar3;
  reference pvVar4;
  value_type_conflict1 *__x;
  size_type __n;
  int sind;
  size_type __n_00;
  long *plVar5;
  code *pcVar6;
  
  piVar1 = &(this->super_EnvironmentNAVXYTHETALATTICE).iteration;
  *piVar1 = *piVar1 + 1;
  for (__n = 0; (long)__n <
                (long)(int)((ulong)((long)(changedcellsV->
                                          super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(changedcellsV->
                                         super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 3);
      __n = __n + 1) {
    pvVar3 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::at(changedcellsV,__n);
    vVar2 = *pvVar3;
    for (__n_00 = 0;
        (long)__n_00 <
        (long)(int)(((long)(this->super_EnvironmentNAVXYTHETALATTICE).affectedpredstatesV.
                           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->super_EnvironmentNAVXYTHETALATTICE).affectedpredstatesV.
                          super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc); __n_00 = __n_00 + 1) {
      pvVar4 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::at
                         (&(this->super_EnvironmentNAVXYTHETALATTICE).affectedpredstatesV,__n_00);
      pcVar6 = (code *)this->GetHashEntry;
      plVar5 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                               super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                       *(long *)&this->field_0x1c8);
      if (((ulong)pcVar6 & 1) != 0) {
        pcVar6 = *(code **)(pcVar6 + *plVar5 + -1);
      }
      __x = (value_type_conflict1 *)
            (*pcVar6)(plVar5,pvVar4->x + vVar2.x,pvVar4->y + vVar2.y,pvVar4->theta);
      if ((__x != (value_type_conflict1 *)0x0) &&
         (__x[4] < (this->super_EnvironmentNAVXYTHETALATTICE).iteration)) {
        std::vector<int,_std::allocator<int>_>::push_back(preds_of_changededgesIDV,__x);
        __x[4] = (this->super_EnvironmentNAVXYTHETALATTICE).iteration;
      }
    }
  }
  return;
}

Assistant:

void EnvironmentNAVXYTHETALAT::GetPredsofChangedEdges(
    std::vector<nav2dcell_t> const* changedcellsV,
    std::vector<int>* preds_of_changededgesIDV)
{
    nav2dcell_t cell;
    sbpl_xy_theta_cell_t affectedcell;
    EnvNAVXYTHETALATHashEntry_t* affectedHashEntry;

    // increment iteration for processing savings
    iteration++;

    for (int i = 0; i < (int)changedcellsV->size(); i++) {
        cell = changedcellsV->at(i);

        // now iterate over all states that could potentially be affected
        for (int sind = 0; sind < (int)affectedpredstatesV.size(); sind++) {
            affectedcell = affectedpredstatesV.at(sind);

            // translate to correct for the offset
            affectedcell.x = affectedcell.x + cell.x;
            affectedcell.y = affectedcell.y + cell.y;

            // insert only if it was actually generated
            affectedHashEntry = (this->*GetHashEntry)(affectedcell.x, affectedcell.y, affectedcell.theta);
            if (affectedHashEntry != NULL && affectedHashEntry->iteration < iteration) {
                preds_of_changededgesIDV->push_back(affectedHashEntry->stateID);
                affectedHashEntry->iteration = iteration; // mark as already inserted
            }
        }
    }
}